

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::AllocaInst>::run(TypedDeleter<LLVMBC::AllocaInst> *this)

{
  TypedDeleter<LLVMBC::AllocaInst> *this_local;
  
  AllocaInst::~AllocaInst(this->ptr);
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}